

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Dial.cxx
# Opt level: O0

void __thiscall Fl_Dial::draw(Fl_Dial *this)

{
  int X;
  int Y;
  int W;
  int H;
  Fl_Dial *this_local;
  
  X = Fl_Widget::x((Fl_Widget *)this);
  Y = Fl_Widget::y((Fl_Widget *)this);
  W = Fl_Widget::w((Fl_Widget *)this);
  H = Fl_Widget::h((Fl_Widget *)this);
  draw(this,X,Y,W,H);
  Fl_Widget::draw_label((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Dial::draw() {
  draw(x(), y(), w(), h());
  draw_label();
}